

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonPal.h
# Opt level: O0

int get_cpuid(int *cpuInfo,int function_id)

{
  int iVar1;
  int function_id_local;
  int *cpuInfo_local;
  
  iVar1 = __get_cpuid(function_id,(uint *)cpuInfo,(uint *)(cpuInfo + 1),(uint *)(cpuInfo + 2),
                      (uint *)(cpuInfo + 3));
  return iVar1;
}

Assistant:

inline int get_cpuid(int cpuInfo[4], int function_id)
{
    return __get_cpuid(
            static_cast<unsigned int>(function_id),
            reinterpret_cast<unsigned int*>(&cpuInfo[0]),
            reinterpret_cast<unsigned int*>(&cpuInfo[1]),
            reinterpret_cast<unsigned int*>(&cpuInfo[2]),
            reinterpret_cast<unsigned int*>(&cpuInfo[3]));
}